

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QLocaleId>::emplace_back_impl<QLocaleId>
          (QVLABase<QLocaleId> *this,qsizetype prealloc,void *array,QLocaleId *args)

{
  qsizetype *pqVar1;
  void *pvVar2;
  long lVar3;
  
  lVar3 = (this->super_QVLABaseBase).s;
  if (lVar3 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar3 = (this->super_QVLABaseBase).s;
  }
  pvVar2 = (this->super_QVLABaseBase).ptr;
  lVar3 = lVar3 * 6;
  *(ushort *)((long)pvVar2 + lVar3 + 4) = args->territory_id;
  *(undefined4 *)((long)pvVar2 + lVar3) = *(undefined4 *)args;
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return (reference)((long)pvVar2 + lVar3);
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }